

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_reference_unittest.cpp
# Opt level: O1

void __thiscall ArrayReference_basics_Test::TestBody(ArrayReference_basics_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  AssertHelperData *pAVar7;
  void *ptr_1;
  by_value v2;
  by_reference vr1;
  by_reference vr2;
  AssertHelper local_e0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  undefined8 local_c8;
  AssertHelperData *local_c0;
  AssertHelper local_b8;
  Array<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  local_b0;
  ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  local_90;
  AssertHelper local_78;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  undefined8 local_68;
  ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  local_60;
  ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  local_48;
  
  iVar3 = posix_memalign((void **)&local_b0,8,0x50);
  if (iVar3 == 0) {
    pAVar7 = (AssertHelperData *)
             CONCAT71(local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>._1_7_,
                      local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>._0_1_);
  }
  else {
    pAVar7 = (AssertHelperData *)0x0;
  }
  local_90.
  super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ._0_8_ = &DAT_0000000a;
  local_78.data_._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_b0,"v1.size()","10",(unsigned_long *)&local_90,(int *)&local_78);
  if ((internal)local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>._0_1_ ==
      (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ == (pointer)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_reference_unittest.cpp"
               ,0x10,pcVar5);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((long *)local_90.
                super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
                ._0_8_ != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)local_90.
                  super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
                  ._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_90.
                              super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
                              ._0_8_ + 8))();
      }
      local_90.
      super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
      ._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_90.
  super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  .size_ = 5;
  paVar1 = &(pAVar7->message).field_2;
  local_68 = 5;
  local_e0.data_ = pAVar7;
  local_d8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar7;
  local_90.
  super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  .pointer_ = (pointer)pAVar7;
  local_70 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar1;
  testing::internal::CmpHelperEQ<double*,double*>
            ((internal *)&local_b0,"vr1.data()","v1.data()",(double **)&local_d8,
             (double **)&local_e0);
  if ((internal)local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>._0_1_ ==
      (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ == (pointer)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_reference_unittest.cpp"
               ,0x14,pcVar5);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_d8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)((long)*(value_type_conflict3 *)local_d8.ptr_ + 8))();
      }
      local_d8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d8.ptr_ = local_70;
  local_e0.data_ = (AssertHelperData *)paVar1;
  testing::internal::CmpHelperEQ<double*,double*>
            ((internal *)&local_b0,"vr2.data()","v1.data()+5",(double **)&local_d8,
             (double **)&local_e0);
  if ((internal)local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>._0_1_ ==
      (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ == (pointer)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_reference_unittest.cpp"
               ,0x15,pcVar5);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_d8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_d8.ptr_ + 8))();
      }
      local_d8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pAVar7[1].file = (char *)0x0;
  *(undefined8 *)&pAVar7[1].line = 0;
  *(undefined8 *)((long)&(pAVar7->message).field_2 + 8) = 0;
  *(value_type_conflict3 *)(pAVar7 + 1) = 0.0;
  (pAVar7->message)._M_string_length = 0;
  (pAVar7->message).field_2._M_allocated_capacity = 0;
  *(undefined8 *)&pAVar7->line = 0;
  (pAVar7->message)._M_dataplus._M_p = (pointer)0x0;
  *(value_type_conflict3 *)pAVar7 = 0.0;
  pAVar7->file = (char *)0x0;
  if (local_90.
      super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
      .size_ != 0) {
    lVar4 = 0;
    do {
      *(undefined8 *)
       ((long)(Type *)local_90.
                      super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
                      .pointer_ + lVar4) = 0x3ff0000000000000;
      lVar4 = lVar4 + 8;
    } while (local_90.
             super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
             .size_ << 3 != lVar4);
  }
  lVar4 = 0;
  local_c0 = pAVar7;
  do {
    local_d8.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &DAT_3ff0000000000000;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&local_b0,"v1[i]","1.",(double *)((long)&local_c0->type + lVar4),
               (double *)&local_d8);
    if ((internal)local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>._0_1_ ==
        (internal)0x0) {
      testing::Message::Message((Message *)&local_d8);
      pcVar5 = "";
      if (local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ !=
          (pointer)0x0) {
        pcVar5 = (char *)*local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.
                          pointer_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_reference_unittest.cpp"
                 ,0x19,pcVar5);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      if (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_d8.ptr_ + 8))();
        }
        local_d8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x28);
  memory::
  ArrayReference<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
  ::operator=(&local_48,
              (ArrayReference<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
               *)&local_78,&local_90);
  lVar4 = 0x28;
  do {
    local_d8.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &DAT_3ff0000000000000;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&local_b0,"v1[i]","1.",(double *)((long)&local_c0->type + lVar4),
               (double *)&local_d8);
    if ((internal)local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>._0_1_ ==
        (internal)0x0) {
      testing::Message::Message((Message *)&local_d8);
      pcVar5 = "";
      if (local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ !=
          (pointer)0x0) {
        pcVar5 = (char *)*local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.
                          pointer_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_reference_unittest.cpp"
                 ,0x1c,pcVar5);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      if (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)((long)*(value_type_conflict3 *)local_d8.ptr_ + 8))();
        }
        local_d8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x50);
  iVar3 = posix_memalign(&local_d8.ptr_,8,0x50);
  pAVar7 = local_c0;
  local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ =
       (pointer)local_d8.ptr_;
  if (iVar3 != 0) {
    local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ =
         (pointer)(AssertHelperData *)0x0;
  }
  local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.size_ = 10;
  local_e0.data_ = (AssertHelperData *)&DAT_0000000a;
  local_b8.data_._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_d8,"v2.size()","10",(unsigned_long *)&local_e0,(int *)&local_b8);
  if (local_d8.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_reference_unittest.cpp"
               ,0x22,pcVar5);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_e0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_e0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_e0.data_ + 8))();
      }
      local_e0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.size_ != 0) {
    lVar4 = 0;
    do {
      *(undefined8 *)
       ((long)(Type *)local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ +
       lVar4) = 0xc024000000000000;
      lVar4 = lVar4 + 8;
    } while (local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.size_ << 3 != lVar4)
    ;
  }
  local_d0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar7;
  local_c8 = 10;
  memory::
  ArrayReference<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
  ::operator=(&local_60,
              (ArrayReference<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
               *)&local_d8,&local_b0);
  local_e0.data_ = pAVar7;
  local_b8.data_ =
       (AssertHelperData *)
       local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_;
  testing::internal::CmpHelperNE<double*,double*>
            ((internal *)&local_d8,"v1.data()","v2.data()",(double **)&local_e0,(double **)&local_b8
            );
  if (local_d8.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if ((AssertHelperData *)local_d0.ptr_ == (AssertHelperData *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_reference_unittest.cpp"
               ,0x26,pcVar5);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_e0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_e0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)((long)*(value_type_conflict3 *)local_e0.data_ + 8))();
      }
      local_e0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lVar4 = 0;
  uVar6 = 0;
  do {
    if (local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.size_ <= uVar6) {
      __assert_fail("i<size_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/include/ArrayView.hpp"
                    ,0x186,
                    "reference memory::ArrayViewImpl<memory::ArrayReference<double, memory::HostCoordinator<double>>, double, memory::HostCoordinator<double>>::operator[](size_type) [R = memory::ArrayReference<double, memory::HostCoordinator<double>>, T = double, Coord = memory::HostCoordinator<double>]"
                   );
    }
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&local_d8,"v1[i]","v2[i]",(double *)((long)&local_c0->type + lVar4),
               (double *)
               ((long)(Type *)local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.
                              pointer_ + lVar4));
    if (local_d8.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_e0);
      pcVar5 = "";
      if ((AssertHelperData *)local_d0.ptr_ != (AssertHelperData *)0x0) {
        pcVar5 = ((local_d0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_reference_unittest.cpp"
                 ,0x29,pcVar5);
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      if (local_e0.data_ != (AssertHelperData *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_e0.data_ != (AssertHelperData *)0x0)) {
          (**(code **)((long)*(value_type_conflict3 *)local_e0.data_ + 8))();
        }
        local_e0.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar6 = uVar6 + 1;
    lVar4 = lVar4 + 8;
  } while (uVar6 != 10);
  if ((AssertHelperData *)
      local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ !=
      (AssertHelperData *)0x0) {
    free(local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_);
  }
  local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ = (pointer)0x0;
  local_b0.super_ArrayView<double,_memory::HostCoordinator<double>_>.size_ = 0;
  if (local_c0 != (AssertHelperData *)0x0) {
    free(local_c0);
  }
  return;
}

Assistant:

TEST(ArrayReference, basics) {
    using namespace memory;

    using by_value = Array<double, HostCoordinator<double>>;
    using by_view  = ArrayView<double, HostCoordinator<double>>;
    using by_reference = typename by_view::array_reference_type;

    // create range by value of length 10
    by_value v1(10);
    EXPECT_EQ(v1.size(), 10);

    by_reference vr1 = v1(0,5);
    by_reference vr2 = v1(5,end);
    EXPECT_EQ(vr1.data(), v1.data());
    EXPECT_EQ(vr2.data(), v1.data()+5);
    v1(all) = 0.;
    vr1 = 1.;
    for(auto i=0; i<5; ++i)
        EXPECT_EQ(v1[i], 1.);
    vr2 = vr1;
    for(auto i=5; i<10; ++i)
        EXPECT_EQ(v1[i], 1.);

    // create a new array of lenght 10
    // and test copying it into the original array
    // via a reference
    by_value v2(10);
    EXPECT_EQ(v2.size(), 10);
    v2(all) = -10.;

    v1(all) = v2;
    EXPECT_NE(v1.data(), v2.data());

    for(auto i : v1.range())
        EXPECT_EQ(v1[i], v2[i]);
}